

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_NtkCollectUser(Acb_Ntk_t *p,Vec_Ptr_t *vUser)

{
  int *piVar1;
  int iVar2;
  Acb_ObjType_t AVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  Vec_Ptr_t *pVVar8;
  long lVar9;
  int iVar10;
  
  pVVar8 = vUser;
  p_00 = Vec_IntAlloc(vUser->nSize);
  iVar2 = Abc_NamObjNumMax(p->pDesign->pStrs);
  p_01 = Vec_IntAlloc(iVar2);
  p_01->nSize = iVar2;
  if (p_01->pArray != (int *)0x0) {
    pVVar8 = (Vec_Ptr_t *)0x0;
    memset(p_01->pArray,0,(long)iVar2 << 2);
  }
  pVVar6 = (Vec_Ptr_t *)0x1;
  while (iVar10 = (int)pVVar6, iVar10 < (p->vObjType).nSize) {
    pVVar8 = pVVar6;
    AVar3 = Acb_ObjType(p,iVar10);
    if (AVar3 != ABC_OPER_NONE) {
      pVVar8 = pVVar6;
      iVar4 = Acb_ObjIsCio(p,iVar10);
      if (iVar4 == 0) {
        iVar4 = Acb_ObjName(p,iVar10);
        pVVar8 = pVVar6;
        if (0 < iVar4) {
          uVar5 = Acb_ObjName(p,iVar10);
          iVar4 = Acb_ObjCopy(p,iVar10);
          pVVar8 = (Vec_Ptr_t *)(ulong)uVar5;
          Vec_IntWriteEntry(p_01,uVar5,iVar4);
        }
      }
    }
    pVVar6 = (Vec_Ptr_t *)(ulong)(iVar10 + 1);
  }
  iVar10 = 0;
  do {
    iVar4 = (int)pVVar8;
    uVar5 = vUser->nSize;
    if ((int)uVar5 <= iVar10) {
      if (p_00->nSize == uVar5) {
        Vec_IntFree(p_01);
        if (1 < (int)uVar5) {
          Vec_IntSort(p_00,iVar4);
          iVar2 = 1;
          for (uVar7 = 1; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            piVar1 = p_00->pArray;
            if (piVar1[uVar7] != piVar1[uVar7 - 1]) {
              lVar9 = (long)iVar2;
              iVar2 = iVar2 + 1;
              piVar1[lVar9] = piVar1[uVar7];
            }
          }
          p_00->nSize = iVar2;
        }
        return p_00;
      }
      __assert_fail("Vec_IntSize(vRes) == Vec_PtrSize(vUser)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x26c,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
    }
    pVVar6 = (Vec_Ptr_t *)Vec_PtrEntry(vUser,iVar10);
    pVVar8 = pVVar6;
    iVar4 = Acb_NtkStrId(p,(char *)pVVar6);
    if (iVar4 < iVar2) {
      iVar4 = Acb_NtkStrId(p,(char *)pVVar6);
      uVar5 = Vec_IntEntry(p_01,iVar4);
      if ((int)uVar5 < 1) {
        __assert_fail("iLit > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                      ,0x268,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
      }
      pVVar8 = (Vec_Ptr_t *)(ulong)(uVar5 >> 1);
      Vec_IntPush(p_00,uVar5 >> 1);
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkCollectUser( Acb_Ntk_t * p, Vec_Ptr_t * vUser )
{
    char * pTemp; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_PtrSize(vUser) );
    Vec_Int_t * vMap = Vec_IntStart( Abc_NamObjNumMax(Acb_NtkNam(p)) );
    Acb_NtkForEachNode( p, i )
        if ( Acb_ObjName(p, i) > 0 )
            Vec_IntWriteEntry( vMap, Acb_ObjName(p, i), Acb_ObjCopy(p, i) );
    Vec_PtrForEachEntry( char *, vUser, pTemp, i )
        if ( Acb_NtkStrId(p, pTemp) < Vec_IntSize(vMap) )
        {
            int iLit = Vec_IntEntry( vMap, Acb_NtkStrId(p, pTemp) );
            assert( iLit > 0 );
            //printf( "Obj = %3d  Name = %3d  Copy = %3d\n", i, Acb_NtkStrId(p, pTemp), iLit );
            Vec_IntPush( vRes, Abc_Lit2Var(iLit) );
        }
    assert( Vec_IntSize(vRes) == Vec_PtrSize(vUser) );
    Vec_IntFree( vMap );
    Vec_IntUniqify( vRes );
    return vRes;
}